

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

value * mjs::anon_unknown_46::json_parse_value(value *__return_storage_ptr__,json_lexer *lex)

{
  json_token_type jVar1;
  json_token *pjVar2;
  gc_heap_ptr_untyped *this;
  gc_heap *h;
  wstring *pwVar3;
  double n;
  wstring_view local_c0;
  undefined4 local_ac;
  wstring_view local_a8;
  string local_98 [2];
  json_token local_78;
  undefined1 local_48 [8];
  json_token token;
  json_lexer *lex_local;
  
  token.pos_ = (size_t)lex;
  json_lexer::skip_whitespace(lex);
  pjVar2 = json_lexer::current_token((json_lexer *)token.pos_);
  json_token::json_token((json_token *)local_48,pjVar2);
  json_lexer::next_token(&local_78,(json_lexer *)token.pos_);
  json_token::~json_token(&local_78);
  jVar1 = json_token::type((json_token *)local_48);
  switch(jVar1) {
  case string:
    this = &json_lexer::global((json_lexer *)token.pos_)->super_gc_heap_ptr_untyped;
    h = gc_heap_ptr_untyped::heap(this);
    pwVar3 = (anonymous_namespace)::json_token::text_abi_cxx11_((json_token *)local_48);
    local_a8 = (wstring_view)
               std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pwVar3);
    string::string(local_98,h,&local_a8);
    value::value(__return_storage_ptr__,local_98);
    string::~string(local_98);
    break;
  case number:
    pwVar3 = (anonymous_namespace)::json_token::text_abi_cxx11_((json_token *)local_48);
    local_c0 = (wstring_view)
               std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pwVar3);
    n = to_number(&local_c0);
    value::value(__return_storage_ptr__,n);
    break;
  case null:
    value::value(__return_storage_ptr__,(value *)value::null);
    break;
  case false_:
    value::value(__return_storage_ptr__,false);
    break;
  case true_:
    value::value(__return_storage_ptr__,true);
    break;
  case lbracket:
    json_parse_array(__return_storage_ptr__,(json_lexer *)token.pos_);
    break;
  default:
    json_lexer::throw_unexpected((json_lexer *)token.pos_,(json_token *)local_48);
  case lbrace:
    json_parse_object(__return_storage_ptr__,(json_lexer *)token.pos_);
  }
  local_ac = 1;
  json_token::~json_token((json_token *)local_48);
  return __return_storage_ptr__;
}

Assistant:

value json_parse_value(json_lexer& lex) {
    lex.skip_whitespace();
    auto token = lex.current_token();
    lex.next_token();
    switch (token.type()) {
    case json_token_type::string:       return value{string{lex.global().heap(), token.text()}};
    case json_token_type::number:       return value{to_number(token.text())};
    case json_token_type::null:         return value::null;
    case json_token_type::false_:       return value{false};
    case json_token_type::true_:        return value{true};
    case json_token_type::lbracket:     return json_parse_array(lex);
    case json_token_type::lbrace:       return json_parse_object(lex);
    default:
        break;
    }
    lex.throw_unexpected(token);
}